

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O2

int doctype5(PROLOG_STATE *state,int tok,char *UNUSED_ptr,char *UNUSED_end,ENCODING *UNUSED_enc)

{
  int iVar1;
  code *pcVar2;
  
  if (tok != 0xf) {
    if (tok == 0x11) {
      iVar1 = 8;
      pcVar2 = prolog2;
    }
    else {
      iVar1 = -1;
      pcVar2 = error;
    }
    state->handler = pcVar2;
    return iVar1;
  }
  return 3;
}

Assistant:

static int PTRCALL
doctype5(PROLOG_STATE *state,
         int tok,
         const char *UNUSED_P(ptr),
         const char *UNUSED_P(end),
         const ENCODING *UNUSED_P(enc))
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_DOCTYPE_NONE;
  case XML_TOK_DECL_CLOSE:
    state->handler = prolog2;
    return XML_ROLE_DOCTYPE_CLOSE;
  }
  return common(state, tok);
}